

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

RefIsNull * __thiscall MixedArena::alloc<wasm::RefIsNull>(MixedArena *this)

{
  RefIsNull *pRVar1;
  
  pRVar1 = (RefIsNull *)allocSpace(this,0x18,8);
  (pRVar1->super_SpecificExpression<(wasm::Expression::Id)42>).super_Expression._id = RefIsNullId;
  (pRVar1->super_SpecificExpression<(wasm::Expression::Id)42>).super_Expression.type.id = 0;
  return pRVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }